

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

int __thiscall FIWadManager::CheckIWAD(FIWadManager *this,char *doomwaddir,WadStuff *wads)

{
  FString *pFVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  BYTE *pBVar5;
  ulong uVar6;
  FString iwad;
  int local_44;
  FString local_40;
  char *local_38;
  
  if (*doomwaddir == '\0') {
    pBVar5 = "";
  }
  else {
    sVar4 = strlen(doomwaddir);
    pBVar5 = "/";
    if (doomwaddir[sVar4 - 1] == '/') {
      pBVar5 = "";
    }
  }
  local_38 = FString::NullString.Nothing;
  local_44 = 0;
  for (uVar6 = 0; uVar6 < (this->mIWadNames).Count; uVar6 = uVar6 + 1) {
    pFVar1 = (this->mIWadNames).Array;
    if ((*(int *)(pFVar1[uVar6].Chars + -0xc) != 0) && (*(int *)((wads->Path).Chars + -0xc) == 0)) {
      local_40.Chars = local_38;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(&local_40,"%s%s%s",doomwaddir,pBVar5,pFVar1[uVar6].Chars);
      FixPathSeperator(&local_40);
      bVar2 = FileExists(local_40.Chars);
      if (bVar2) {
        iVar3 = ScanIWAD(this,local_40.Chars);
        wads->Type = iVar3;
        if (iVar3 != -1) {
          FString::operator=(&wads->Path,&local_40);
          FString::operator=(&wads->Name,&(this->mIWads).Array[wads->Type].Name);
          local_44 = local_44 + 1;
        }
      }
      FString::~FString(&local_40);
    }
    wads = wads + 1;
  }
  return local_44;
}

Assistant:

int FIWadManager::CheckIWAD (const char *doomwaddir, WadStuff *wads)
{
	const char *slash;
	int numfound;

	numfound = 0;

	slash = (doomwaddir[0] && doomwaddir[strlen (doomwaddir)-1] != '/') ? "/" : "";

	// Search for a pre-defined IWAD
	for (unsigned i=0; i< mIWadNames.Size(); i++)
	{
		if (mIWadNames[i].IsNotEmpty() && wads[i].Path.IsEmpty())
		{
			FString iwad;
			
			iwad.Format ("%s%s%s", doomwaddir, slash, mIWadNames[i].GetChars());
			FixPathSeperator (iwad);
			if (FileExists (iwad))
			{
				wads[i].Type = ScanIWAD (iwad);
				if (wads[i].Type != -1)
				{
					wads[i].Path = iwad;
					wads[i].Name = mIWads[wads[i].Type].Name;
					numfound++;
				}
			}
		}
	}

	return numfound;
}